

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void beginExpansion(char *str,bool owned,char *name)

{
  LexerState *pLVar1;
  size_t sVar2;
  Expansion *pEVar3;
  char *pcVar4;
  int *piVar5;
  
  sVar2 = strlen(str);
  if (sVar2 != 0) {
    if (name != (char *)0x0) {
      lexer_CheckRecursionDepth();
    }
    pEVar3 = (Expansion *)malloc(0x30);
    pLVar1 = lexerState;
    if (pEVar3 == (Expansion *)0x0) {
      piVar5 = __errno_location();
      pcVar4 = strerror(*piVar5);
      fatalerror("Unable to allocate new expansion: %s\n",pcVar4);
    }
    pEVar3->parent = lexerState->expansions;
    if (name == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = strdup(name);
    }
    pEVar3->name = pcVar4;
    (pEVar3->contents).unowned = str;
    pEVar3->size = sVar2;
    pEVar3->offset = 0;
    pEVar3->owned = owned;
    pLVar1->expansions = pEVar3;
  }
  return;
}

Assistant:

static void beginExpansion(char const *str, bool owned, char const *name)
{
	size_t size = strlen(str);

	// Do not expand empty strings
	if (!size)
		return;

	if (name)
		lexer_CheckRecursionDepth();

	struct Expansion *exp = (struct Expansion *)malloc(sizeof(*exp));

	if (!exp)
		fatalerror("Unable to allocate new expansion: %s\n", strerror(errno));

	exp->parent = lexerState->expansions;
	exp->name = name ? strdup(name) : NULL;
	exp->contents.unowned = str;
	exp->size = size;
	exp->offset = 0;
	exp->owned = owned;

	lexerState->expansions = exp;
}